

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O2

char * Fantasy_Movie_parse_json_table
                 (flatcc_json_parser_t *ctx,char *buf,char *end,flatcc_builder_ref_t *result)

{
  int iVar1;
  flatcc_builder_ref_t fVar2;
  char *pcVar3;
  char *pcVar4;
  uint64_t uVar5;
  flatcc_json_parser_integral_symbol_f **type_parsers;
  size_t sVar6;
  flatbuffers_voffset_t fVar7;
  size_t h_unions;
  int more;
  flatcc_builder_ref_t *local_38;
  
  *result = 0;
  iVar1 = flatcc_builder_start_table(ctx->ctx,10);
  if ((iVar1 == 0) &&
     (pcVar3 = flatcc_json_parser_prepare_unions(ctx,buf,end,5,&h_unions), pcVar3 != end)) {
    local_38 = result;
    buf = flatcc_json_parser_object_start(ctx,buf,end,&more);
    while (more != 0) {
      pcVar4 = flatcc_json_parser_symbol_start(ctx,buf,end);
      uVar5 = flatcc_json_parser_symbol_part(pcVar4,end);
      pcVar3 = pcVar4;
      if (uVar5 < 0x6368617261637465) {
        if (uVar5 == 0x63616d656f5f7479) {
          pcVar4 = pcVar4 + 8;
          uVar5 = flatcc_json_parser_symbol_part(pcVar4,end);
          pcVar3 = pcVar4;
          if (((uVar5 & 0xffff000000000000) == 0x7065000000000000) &&
             (pcVar3 = flatcc_json_parser_match_symbol(ctx,pcVar4,end,2), pcVar4 != pcVar3)) {
            sVar6 = 3;
            fVar7 = 7;
            type_parsers = Fantasy_Movie_parse_json_table::symbolic_parsers_1;
LAB_00110f38:
            pcVar3 = flatcc_json_parser_union_type
                               (ctx,pcVar3,end,sVar6,fVar7,h_unions,type_parsers,
                                Fantasy_Character_parse_json_union);
            goto LAB_00111053;
          }
        }
        else if (uVar5 == 0x616e7461676f6e69) {
          pcVar4 = pcVar4 + 8;
          uVar5 = flatcc_json_parser_symbol_part(pcVar4,end);
          if (uVar5 >> 8 == 0x73745f74797065) {
            pcVar3 = flatcc_json_parser_match_symbol(ctx,pcVar4,end,7);
            if (pcVar4 != pcVar3) {
              sVar6 = 1;
              fVar7 = 3;
              type_parsers = Fantasy_Movie_parse_json_table::symbolic_parsers;
              goto LAB_00110f38;
            }
          }
          else {
            pcVar3 = pcVar4;
            if (((uVar5 & 0xffff000000000000) == 0x7374000000000000) &&
               (pcVar3 = flatcc_json_parser_match_symbol(ctx,pcVar4,end,2), pcVar4 != pcVar3)) {
              sVar6 = 1;
              fVar7 = 3;
              goto LAB_00111028;
            }
          }
        }
        else if (((uVar5 & 0x7fffffffff000000) == 0x63616d656f000000) &&
                (pcVar3 = flatcc_json_parser_match_symbol(ctx,pcVar4,end,5), pcVar4 != pcVar3)) {
          sVar6 = 3;
          fVar7 = 7;
LAB_00111028:
          pcVar3 = flatcc_json_parser_union
                             (ctx,pcVar3,end,sVar6,fVar7,h_unions,Fantasy_Character_parse_json_union
                             );
          goto LAB_00111053;
        }
LAB_0011104b:
        pcVar3 = flatcc_json_parser_unmatched_symbol(ctx,pcVar3,end);
      }
      else {
        if (0x6d61696e5f636860 < uVar5) {
          if (uVar5 == 0x736964655f6b6963) {
            pcVar4 = pcVar4 + 8;
            uVar5 = flatcc_json_parser_symbol_part(pcVar4,end);
            if (uVar5 >> 0x10 == 0x6b5f74797065) {
              pcVar3 = flatcc_json_parser_match_symbol(ctx,pcVar4,end,6);
              if (pcVar4 != pcVar3) {
                sVar6 = 2;
                fVar7 = 5;
                type_parsers = Fantasy_Movie_parse_json_table::symbolic_parsers_4;
                goto LAB_00110f38;
              }
            }
            else {
              pcVar3 = pcVar4;
              if (((char)(uVar5 >> 0x38) == 'k') &&
                 (pcVar3 = flatcc_json_parser_match_symbol(ctx,pcVar4,end,1), pcVar4 != pcVar3)) {
                sVar6 = 2;
                fVar7 = 5;
                goto LAB_00111028;
              }
            }
          }
          else if (uVar5 == 0x6d61696e5f636861) {
            pcVar3 = pcVar4 + 8;
            uVar5 = flatcc_json_parser_symbol_part(pcVar3,end);
            if (uVar5 == 0x7261637465725f74) {
              pcVar4 = pcVar4 + 0x10;
              uVar5 = flatcc_json_parser_symbol_part(pcVar4,end);
              if ((uint)(uVar5 >> 0x28) == 0x797065) {
                pcVar3 = flatcc_json_parser_match_symbol(ctx,pcVar4,end,3);
                if (pcVar4 == pcVar3) {
                  pcVar3 = flatcc_json_parser_unmatched_symbol(ctx,pcVar3,end);
                }
                else {
                  pcVar3 = flatcc_json_parser_union_type
                                     (ctx,pcVar3,end,0,1,h_unions,
                                      Fantasy_Movie_parse_json_table::symbolic_parsers_3,
                                      Fantasy_Character_parse_json_union);
                }
              }
              else {
                pcVar3 = flatcc_json_parser_unmatched_symbol(ctx,pcVar4,end);
              }
            }
            else {
              pcVar4 = pcVar3;
              if (((uVar5 & 0xffffffffffff0000) == 0x7261637465720000) &&
                 (pcVar4 = flatcc_json_parser_match_symbol(ctx,pcVar3,end,6), pcVar3 != pcVar4)) {
                pcVar3 = flatcc_json_parser_union
                                   (ctx,pcVar4,end,0,1,h_unions,Fantasy_Character_parse_json_union);
              }
              else {
                pcVar3 = flatcc_json_parser_unmatched_symbol(ctx,pcVar4,end);
              }
            }
            goto LAB_00111053;
          }
          goto LAB_0011104b;
        }
        if (uVar5 != 0x6368617261637465) goto LAB_0011104b;
        pcVar4 = pcVar4 + 8;
        uVar5 = flatcc_json_parser_symbol_part(pcVar4,end);
        if (uVar5 >> 8 == 0x72735f74797065) {
          pcVar3 = flatcc_json_parser_match_symbol(ctx,pcVar4,end,7);
          if (pcVar4 == pcVar3) goto LAB_0011104b;
          pcVar3 = flatcc_json_parser_union_type_vector
                             (ctx,pcVar3,end,4,9,h_unions,
                              Fantasy_Movie_parse_json_table::symbolic_parsers_2,
                              Fantasy_Character_parse_json_union,
                              Fantasy_Character_json_union_accept_type);
        }
        else {
          pcVar3 = pcVar4;
          if (((uVar5 & 0xffff000000000000) != 0x7273000000000000) ||
             (pcVar3 = flatcc_json_parser_match_symbol(ctx,pcVar4,end,2), pcVar4 == pcVar3))
          goto LAB_0011104b;
          pcVar3 = flatcc_json_parser_union_vector
                             (ctx,pcVar3,end,4,9,h_unions,Fantasy_Character_parse_json_union);
        }
      }
LAB_00111053:
      buf = flatcc_json_parser_object_end(ctx,pcVar3,end,&more);
    }
    if (ctx->error == 0) {
      buf = flatcc_json_parser_finalize_unions(ctx,buf,end,h_unions);
      fVar2 = flatcc_builder_end_table(ctx->ctx);
      *local_38 = fVar2;
      if (fVar2 != 0) {
        return buf;
      }
    }
  }
  pcVar3 = flatcc_json_parser_set_error(ctx,buf,end,0x23);
  return pcVar3;
}

Assistant:

static const char *Fantasy_Movie_parse_json_table(flatcc_json_parser_t *ctx, const char *buf, const char *end, flatcc_builder_ref_t *result)
{
    int more;
    void *pval;
    flatcc_builder_ref_t ref, *pref;
    const char *mark;
    uint64_t w;
    size_t h_unions;

    *result = 0;
    if (flatcc_builder_start_table(ctx->ctx, 10)) goto failed;
    if (end == flatcc_json_parser_prepare_unions(ctx, buf, end, 5, &h_unions)) goto failed;
    buf = flatcc_json_parser_object_start(ctx, buf, end, &more);
    while (more) {
        buf = flatcc_json_parser_symbol_start(ctx, buf, end);
        w = flatcc_json_parser_symbol_part(buf, end);
        if (w < 0x6368617261637465) { /* branch "characte" */
            if (w == 0x616e7461676f6e69) { /* descend "antagoni" */
                buf += 8;
                w = flatcc_json_parser_symbol_part(buf, end);
                if ((w & 0xffffffffffffff00) == 0x73745f7479706500) { /* "st_type" */
                    buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 7);
                    if (mark != buf) {
                        static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {
                                Fantasy_Character_parse_json_enum,
                                monster_test_local_Fantasy_json_parser_enum,
                                monster_test_global_json_parser_enum, 0 };
                        buf = flatcc_json_parser_union_type(ctx, buf, end, 1, 3, h_unions, symbolic_parsers, Fantasy_Character_parse_json_union);
                    } else {
                        buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                    }
                } else { /* "st_type" */
                    if ((w & 0xffff000000000000) == 0x7374000000000000) { /* "st" */
                        buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 2);
                        if (mark != buf) {
                            buf = flatcc_json_parser_union(ctx, buf, end, 1, 3, h_unions, Fantasy_Character_parse_json_union);
                        } else {
                            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                        }
                    } else { /* "st" */
                        buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                    } /* "st" */
                } /* "st_type" */
            } else { /* descend "antagoni" */
                if (w == 0x63616d656f5f7479) { /* descend "cameo_ty" */
                    buf += 8;
                    w = flatcc_json_parser_symbol_part(buf, end);
                    if ((w & 0xffff000000000000) == 0x7065000000000000) { /* "pe" */
                        buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 2);
                        if (mark != buf) {
                            static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {
                                    Fantasy_Character_parse_json_enum,
                                    monster_test_local_Fantasy_json_parser_enum,
                                    monster_test_global_json_parser_enum, 0 };
                            buf = flatcc_json_parser_union_type(ctx, buf, end, 3, 7, h_unions, symbolic_parsers, Fantasy_Character_parse_json_union);
                        } else {
                            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                        }
                    } else { /* "pe" */
                        buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                    } /* "pe" */
                } else { /* descend "cameo_ty" */
                    if ((w & 0xffffffffff000000) == 0x63616d656f000000) { /* "cameo" */
                        buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 5);
                        if (mark != buf) {
                            buf = flatcc_json_parser_union(ctx, buf, end, 3, 7, h_unions, Fantasy_Character_parse_json_union);
                        } else {
                            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                        }
                    } else { /* "cameo" */
                        buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                    } /* "cameo" */
                } /* descend "cameo_ty" */
            } /* descend "antagoni" */
        } else { /* branch "characte" */
            if (w < 0x6d61696e5f636861) { /* branch "main_cha" */
                if (w == 0x6368617261637465) { /* descend "characte" */
                    buf += 8;
                    w = flatcc_json_parser_symbol_part(buf, end);
                    if ((w & 0xffffffffffffff00) == 0x72735f7479706500) { /* "rs_type" */
                        buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 7);
                        if (mark != buf) {
                            static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {
                                    Fantasy_Character_parse_json_enum,
                                    monster_test_local_Fantasy_json_parser_enum,
                                    monster_test_global_json_parser_enum, 0 };
                            buf = flatcc_json_parser_union_type_vector(ctx, buf, end, 4, 9, h_unions, symbolic_parsers, Fantasy_Character_parse_json_union, Fantasy_Character_json_union_accept_type);
                        } else {
                            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                        }
                    } else { /* "rs_type" */
                        if ((w & 0xffff000000000000) == 0x7273000000000000) { /* "rs" */
                            buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 2);
                            if (mark != buf) {
                                buf = flatcc_json_parser_union_vector(ctx, buf, end, 4, 9, h_unions, Fantasy_Character_parse_json_union);
                            } else {
                                buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                            }
                        } else { /* "rs" */
                            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                        } /* "rs" */
                    } /* "rs_type" */
                } else { /* descend "characte" */
                    buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                } /* descend "characte" */
            } else { /* branch "main_cha" */
                if (w == 0x6d61696e5f636861) { /* descend "main_cha" */
                    buf += 8;
                    w = flatcc_json_parser_symbol_part(buf, end);
                    if (w == 0x7261637465725f74) { /* descend "racter_t" */
                        buf += 8;
                        w = flatcc_json_parser_symbol_part(buf, end);
                        if ((w & 0xffffff0000000000) == 0x7970650000000000) { /* "ype" */
                            buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 3);
                            if (mark != buf) {
                                static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {
                                        Fantasy_Character_parse_json_enum,
                                        monster_test_local_Fantasy_json_parser_enum,
                                        monster_test_global_json_parser_enum, 0 };
                                buf = flatcc_json_parser_union_type(ctx, buf, end, 0, 1, h_unions, symbolic_parsers, Fantasy_Character_parse_json_union);
                            } else {
                                buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                            }
                        } else { /* "ype" */
                            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                        } /* "ype" */
                    } else { /* descend "racter_t" */
                        if ((w & 0xffffffffffff0000) == 0x7261637465720000) { /* "racter" */
                            buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 6);
                            if (mark != buf) {
                                buf = flatcc_json_parser_union(ctx, buf, end, 0, 1, h_unions, Fantasy_Character_parse_json_union);
                            } else {
                                buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                            }
                        } else { /* "racter" */
                            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                        } /* "racter" */
                    } /* descend "racter_t" */
                } else { /* descend "main_cha" */
                    if (w == 0x736964655f6b6963) { /* descend "side_kic" */
                        buf += 8;
                        w = flatcc_json_parser_symbol_part(buf, end);
                        if ((w & 0xffffffffffff0000) == 0x6b5f747970650000) { /* "k_type" */
                            buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 6);
                            if (mark != buf) {
                                static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {
                                        Fantasy_Character_parse_json_enum,
                                        monster_test_local_Fantasy_json_parser_enum,
                                        monster_test_global_json_parser_enum, 0 };
                                buf = flatcc_json_parser_union_type(ctx, buf, end, 2, 5, h_unions, symbolic_parsers, Fantasy_Character_parse_json_union);
                            } else {
                                buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                            }
                        } else { /* "k_type" */
                            if ((w & 0xff00000000000000) == 0x6b00000000000000) { /* "k" */
                                buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 1);
                                if (mark != buf) {
                                    buf = flatcc_json_parser_union(ctx, buf, end, 2, 5, h_unions, Fantasy_Character_parse_json_union);
                                } else {
                                    buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                                }
                            } else { /* "k" */
                                buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                            } /* "k" */
                        } /* "k_type" */
                    } else { /* descend "side_kic" */
                        buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                    } /* descend "side_kic" */
                } /* descend "main_cha" */
            } /* branch "main_cha" */
        } /* branch "characte" */
        buf = flatcc_json_parser_object_end(ctx, buf, end, &more);
    }
    if (ctx->error) goto failed;
    buf = flatcc_json_parser_finalize_unions(ctx, buf, end, h_unions);
    if (!(*result = flatcc_builder_end_table(ctx->ctx))) goto failed;
    return buf;
failed:
    return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_runtime);
}